

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleParallelAnalyzer::SimpleParallelAnalyzer(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerSettings *this_00;
  SimpleParallelAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzer_0011fca0;
  this->mLastFrameWidth = -1;
  this_00 = (SimpleParallelAnalyzerSettings *)operator_new(0x68);
  SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(this_00);
  std::
  unique_ptr<SimpleParallelAnalyzerSettings,std::default_delete<SimpleParallelAnalyzerSettings>>::
  unique_ptr<std::default_delete<SimpleParallelAnalyzerSettings>,void>
            ((unique_ptr<SimpleParallelAnalyzerSettings,std::default_delete<SimpleParallelAnalyzerSettings>>
              *)&this->mSettings,this_00);
  std::unique_ptr<SimpleParallelAnalyzerResults,std::default_delete<SimpleParallelAnalyzerResults>>
  ::unique_ptr<std::default_delete<SimpleParallelAnalyzerResults>,void>
            ((unique_ptr<SimpleParallelAnalyzerResults,std::default_delete<SimpleParallelAnalyzerResults>>
              *)&this->mResults);
  std::vector<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::vector(&this->mData);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->mDataMasks);
  std::vector<Channel,_std::allocator<Channel>_>::vector(&this->mDataChannels);
  SimpleParallelSimulationDataGenerator::SimpleParallelSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  std::
  unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>::
  get(&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

SimpleParallelAnalyzer::SimpleParallelAnalyzer()
    : Analyzer2(), mSettings( new SimpleParallelAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );
    UseFrameV2();
}